

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.c
# Opt level: O1

int comex_group_free(comex_group_t id)

{
  comex_igroup_t *pcVar1;
  comex_igroup_t *pcVar2;
  comex_igroup_t **igroup;
  
  igroup = &group_list;
  pcVar1 = (comex_igroup_t *)0x0;
  do {
    pcVar2 = pcVar1;
    igroup = &((comex_igroup_t *)igroup)->next->next;
    if ((comex_igroup_t *)igroup == (comex_igroup_t *)0x0) {
      __assert_fail("current_group_list_item != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/groups.c"
                    ,0xaf,"int comex_group_free(comex_group_t)");
    }
    pcVar1 = (comex_igroup_t *)igroup;
  } while (((comex_igroup_t *)igroup)->id != id);
  if (pcVar2 != (comex_igroup_t *)0x0) {
    pcVar2->next = ((comex_igroup_t *)igroup)->next;
  }
  comex_igroup_finalize((comex_igroup_t *)igroup);
  free(igroup);
  return 0;
}

Assistant:

int comex_group_free(comex_group_t id)
{
    comex_igroup_t *current_group_list_item = group_list;
    comex_igroup_t *previous_group_list_item = NULL;

    /* find the group to free */
    while (current_group_list_item != NULL) {
        if (current_group_list_item->id == id) {
            break;
        }
        previous_group_list_item = current_group_list_item;
        current_group_list_item = current_group_list_item->next;
    }
    /* make sure we found a group */
    assert(current_group_list_item != NULL);
    /* remove the group from the linked list */
    if (previous_group_list_item != NULL) {
        previous_group_list_item->next = current_group_list_item->next;
    }
    /* free the group */
    comex_igroup_finalize(current_group_list_item);
    free(current_group_list_item);

    return COMEX_SUCCESS;
}